

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall Label::Label(Label *this,Identifier *name)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->originalName,(string *)name);
  this->value = 0;
  this->physicalValue = 0;
  *(undefined4 *)((long)&this->physicalValue + 7) = 0;
  this->updateInfo = true;
  this->info = 0;
  this->section = 0;
  return;
}

Assistant:

Label::Label(const Identifier &name) :
	name(name),
	originalName(name)
{
}